

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::Compiler::flush_phi_required(Compiler *this,BlockID from,BlockID to)

{
  size_t sVar1;
  SPIRBlock *pSVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  pSVar2 = Variant::get<diligent_spirv_cross::SPIRBlock>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + to.id);
  sVar1 = (pSVar2->phi_variables).super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.buffer_size
  ;
  if (sVar1 == 0) {
    bVar4 = false;
  }
  else {
    lVar3 = 0;
    do {
      bVar4 = *(uint32_t *)
               ((long)&(((pSVar2->phi_variables).
                         super_VectorView<diligent_spirv_cross::SPIRBlock::Phi>.ptr)->parent).id +
               lVar3) == from.id;
      if (bVar4) {
        return bVar4;
      }
      bVar5 = sVar1 * 0xc + -0xc != lVar3;
      lVar3 = lVar3 + 0xc;
    } while (bVar5);
  }
  return bVar4;
}

Assistant:

bool Compiler::flush_phi_required(BlockID from, BlockID to) const
{
	auto &child = get<SPIRBlock>(to);
	for (auto &phi : child.phi_variables)
		if (phi.parent == from)
			return true;
	return false;
}